

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O3

int Cudd_zddPrintMinterm(DdManager *zdd,DdNode *node)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *list;
  long lVar3;
  int iVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar7;
  
  iVar2 = zdd->sizeZ;
  list = (int *)malloc((long)iVar2 * 4);
  auVar1 = _DAT_0094e250;
  if (list == (int *)0x0) {
    zdd->errorCode = CUDD_MEMORY_OUT;
    iVar2 = 0;
  }
  else {
    if (0 < iVar2) {
      lVar3 = (long)iVar2 + -1;
      auVar4._8_4_ = (int)lVar3;
      auVar4._0_8_ = lVar3;
      auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
      lVar3 = 0;
      auVar4 = auVar4 ^ _DAT_0094e250;
      auVar6 = _DAT_0094f530;
      auVar8 = _DAT_0094e240;
      do {
        auVar9 = auVar8 ^ auVar1;
        iVar5 = auVar4._4_4_;
        if ((bool)(~(auVar9._4_4_ == iVar5 && auVar4._0_4_ < auVar9._0_4_ || iVar5 < auVar9._4_4_) &
                  1)) {
          *(undefined4 *)((long)list + lVar3) = 3;
        }
        if ((auVar9._12_4_ != auVar4._12_4_ || auVar9._8_4_ <= auVar4._8_4_) &&
            auVar9._12_4_ <= auVar4._12_4_) {
          *(undefined4 *)((long)list + lVar3 + 4) = 3;
        }
        auVar9 = auVar6 ^ auVar1;
        iVar10 = auVar9._4_4_;
        if (iVar10 <= iVar5 && (iVar10 != iVar5 || auVar9._0_4_ <= auVar4._0_4_)) {
          *(undefined4 *)((long)list + lVar3 + 8) = 3;
          *(undefined4 *)((long)list + lVar3 + 0xc) = 3;
        }
        lVar7 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 4;
        auVar8._8_8_ = lVar7 + 4;
        lVar7 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 4;
        auVar6._8_8_ = lVar7 + 4;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(iVar2 + 3U >> 2) << 4 != lVar3);
    }
    zdd_print_minterm_aux(zdd,node,0,list);
    free(list);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Cudd_zddPrintMinterm(
  DdManager * zdd,
  DdNode * node)
{
    int         i, size;
    int         *list;

    size = (int)zdd->sizeZ;
    list = ABC_ALLOC(int, size);
    if (list == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < size; i++) list[i] = 3; /* bogus value should disappear */
    zdd_print_minterm_aux(zdd, node, 0, list);
    ABC_FREE(list);
    return(1);

}